

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomThreeAction::Look(GreenRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  allocator local_31;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BASIN) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_30,"The basin looks clean. You feel you can clean anything here.",
               &local_31);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return pAVar2;
  }
  pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
  return pAVar2;
}

Assistant:

ActionResults * GreenRoomThreeAction::Look() {
    if(commands->getMainItem() == BASIN) {
        return new ActionResults(CURRENT, "The basin looks clean. You feel you can clean anything here.");
    } else {
        return AbstractRoomAction::Look();
    }

}